

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# communicator.cpp
# Opt level: O3

bool __thiscall
GGSock::Communicator::setMessageCallback(Communicator *this,TMessageType type,CBMessage *callback)

{
  pthread_mutex_t *__mutex;
  _Head_base<0UL,_GGSock::Communicator::Data_*,_false> _Var1;
  int iVar2;
  mapped_type *this_00;
  TMessageType local_1a;
  
  _Var1._M_head_impl =
       (this->data_)._M_t.
       super___uniq_ptr_impl<GGSock::Communicator::Data,_std::default_delete<GGSock::Communicator::Data>_>
       ._M_t.
       super__Tuple_impl<0UL,_GGSock::Communicator::Data_*,_std::default_delete<GGSock::Communicator::Data>_>
       .super__Head_base<0UL,_GGSock::Communicator::Data_*,_false>._M_head_impl;
  __mutex = (pthread_mutex_t *)&(_Var1._M_head_impl)->mutex;
  local_1a = type;
  iVar2 = pthread_mutex_lock(__mutex);
  if (iVar2 == 0) {
    this_00 = std::
              map<unsigned_short,_std::function<unsigned_short_(const_char_*,_unsigned_int)>,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_std::function<unsigned_short_(const_char_*,_unsigned_int)>_>_>_>
              ::operator[](&(_Var1._M_head_impl)->messageCallback,&local_1a);
    std::function<unsigned_short_(const_char_*,_unsigned_int)>::operator=(this_00,callback);
    pthread_mutex_unlock(__mutex);
    return true;
  }
  std::__throw_system_error(iVar2);
}

Assistant:

bool Communicator::setMessageCallback(TMessageType type, CBMessage && callback) {
        auto & data = getData();

        std::lock_guard<std::mutex> lock(data.mutex);

        data.messageCallback[type] = std::move(callback);

        return true;
    }